

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersection.cpp
# Opt level: O2

bool vera::containsValue(vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                         *_points,vec3 *_point)

{
  reference v1;
  int i;
  ulong __n;
  
  for (__n = 0; __n < (ulong)(((long)(_points->
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(_points->
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) / 0xc);
      __n = __n + 1) {
    v1 = std::
         vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
         ::at(_points,__n);
    glm::operator-(v1,_point);
  }
  return false;
}

Assistant:

bool containsValue(std::vector<glm::vec3>* _points, const glm::vec3& _point) {
    for (int i = 0; i < _points->size(); i++)
        if ((_points->at(i)-_point).length()<EPS )
            return true;   
    return false;
}